

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_patternstring.cpp
# Opt level: O2

UnicodeString *
icu_63::number::impl::PatternStringUtils::propertiesToPatternString
          (UnicodeString *__return_storage_ptr__,DecimalFormatProperties *properties,
          UErrorCode *status)

{
  double input;
  bool bVar1;
  bool bVar2;
  short sVar3;
  NullableValue<UNumberFormatPadPosition> NVar4;
  uint uVar5;
  digits_t dVar6;
  char16_t cVar7;
  uint uVar8;
  int32_t iVar9;
  int32_t iVar10;
  int32_t x;
  int32_t iVar11;
  int32_t iVar12;
  int32_t iVar13;
  int32_t iVar14;
  int32_t iVar15;
  int32_t startIndex;
  uint uVar16;
  uint uVar17;
  int32_t iVar18;
  undefined4 uVar19;
  int iVar20;
  uint *status_00;
  int iVar21;
  int offset;
  bool bVar22;
  uint local_498;
  UnicodeString digitsString;
  DecimalQuantity incrementQuantity;
  UnicodeString str;
  UnicodeString nsp;
  UnicodeString npp;
  UnicodeString paddingString;
  UnicodeString ns;
  UnicodeString np;
  UnicodeString psp;
  UnicodeString ppp;
  UnicodeString local_1b0;
  UnicodeString local_170;
  UnicodeString local_130;
  UnicodeString local_f0;
  UnicodeString ps;
  UnicodeString pp;
  
  (__return_storage_ptr__->super_Replaceable).super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_003a7268;
  (__return_storage_ptr__->fUnion).fStackFields.fLengthAndFlags = 2;
  local_498 = uprv_min_63(properties->secondaryGroupingSize,100);
  uVar8 = uprv_min_63(properties->groupingSize,100);
  iVar9 = uprv_min_63(properties->formatWidth,100);
  NVar4 = properties->padPosition;
  UnicodeString::UnicodeString(&paddingString,&properties->padString);
  iVar10 = uprv_min_63(properties->minimumIntegerDigits,100);
  iVar10 = uprv_max_63(iVar10,0);
  x = uprv_min_63(properties->maximumIntegerDigits,100);
  iVar11 = uprv_min_63(properties->minimumFractionDigits,100);
  iVar11 = uprv_max_63(iVar11,0);
  iVar12 = uprv_min_63(properties->maximumFractionDigits,100);
  iVar13 = uprv_min_63(properties->minimumSignificantDigits,100);
  iVar14 = uprv_min_63(properties->maximumSignificantDigits,100);
  bVar1 = properties->decimalSeparatorAlwaysShown;
  iVar15 = uprv_min_63(properties->minimumExponentDigits,100);
  bVar2 = properties->exponentSignAlwaysShown;
  UnicodeString::UnicodeString(&pp,&properties->positivePrefix);
  UnicodeString::UnicodeString(&ppp,&properties->positivePrefixPattern);
  UnicodeString::UnicodeString(&ps,&properties->positiveSuffix);
  UnicodeString::UnicodeString(&psp,&properties->positiveSuffixPattern);
  UnicodeString::UnicodeString(&np,&properties->negativePrefix);
  UnicodeString::UnicodeString(&npp,&properties->negativePrefixPattern);
  UnicodeString::UnicodeString(&ns,&properties->negativeSuffix);
  UnicodeString::UnicodeString(&nsp,&properties->negativeSuffixPattern);
  if ((ppp.fUnion.fStackFields.fLengthAndFlags._0_1_ & 1) == 0) {
    UnicodeString::append(__return_storage_ptr__,&ppp);
  }
  AffixUtils::escape((UnicodeString *)&incrementQuantity,&pp);
  UnicodeString::append(__return_storage_ptr__,(UnicodeString *)&incrementQuantity);
  UnicodeString::~UnicodeString((UnicodeString *)&incrementQuantity);
  sVar3 = (__return_storage_ptr__->fUnion).fStackFields.fLengthAndFlags;
  if (sVar3 < 0) {
    startIndex = (__return_storage_ptr__->fUnion).fFields.fLength;
  }
  else {
    startIndex = (int)sVar3 >> 5;
  }
  uVar16 = uprv_min_63(100,-1);
  if ((local_498 == uVar16) ||
     (uVar17 = uprv_min_63(100,-1), uVar16 = uVar8, uVar5 = local_498,
     local_498 == uVar8 || uVar8 == uVar17)) {
    uVar17 = uprv_min_63(100,-1);
    uVar16 = local_498;
    uVar5 = 0;
    if (local_498 == uVar17) {
      uVar16 = uprv_min_63(100,-1);
      bVar22 = uVar8 == uVar16;
      if (bVar22) {
        uVar8 = 0;
      }
      uVar5 = 0;
      uVar16 = uVar8;
      if (bVar22) {
        local_498 = 0;
      }
    }
  }
  input = properties->roundingIncrement;
  digitsString.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003a7268
  ;
  digitsString.fUnion.fStackFields.fLengthAndFlags = 2;
  iVar18 = uprv_min_63(100,-1);
  if (iVar14 == iVar18) {
    if ((input == 0.0) && (!NAN(input))) goto LAB_00256b04;
    dVar6 = roundingutils::doubleFractionLength(input);
    DecimalQuantity::DecimalQuantity(&incrementQuantity);
    DecimalQuantity::setToDouble(&incrementQuantity,input);
    DecimalQuantity::adjustMagnitude(&incrementQuantity,(int)dVar6);
    DecimalQuantity::roundToMagnitude(&incrementQuantity,0,UNUM_FOUND_HALFEVEN,status);
    DecimalQuantity::toPlainString(&str,&incrementQuantity);
    cVar7 = UnicodeString::doCharAt(&str,0);
    if (cVar7 == L'-') {
      if (-1 < str.fUnion.fStackFields.fLengthAndFlags) {
        str.fUnion.fFields.fLength = (int)str.fUnion.fStackFields.fLengthAndFlags >> 5;
      }
      UnicodeString::doAppend(&digitsString,&str,1,str.fUnion.fFields.fLength + -1);
    }
    else {
      UnicodeString::append(&digitsString,&str);
    }
    iVar21 = -(int)dVar6;
    UnicodeString::~UnicodeString(&str);
    DecimalQuantity::~DecimalQuantity(&incrementQuantity);
  }
  else {
    while( true ) {
      uVar19 = digitsString.fUnion.fFields.fLength;
      if (-1 < digitsString.fUnion.fStackFields.fLengthAndFlags) {
        uVar19 = (int)digitsString.fUnion.fStackFields.fLengthAndFlags >> 5;
      }
      if (iVar13 <= (int)uVar19) break;
      UnicodeString::append(&digitsString,L'@');
    }
    while( true ) {
      uVar19 = digitsString.fUnion.fFields.fLength;
      if (-1 < digitsString.fUnion.fStackFields.fLengthAndFlags) {
        uVar19 = (int)digitsString.fUnion.fStackFields.fLengthAndFlags >> 5;
      }
      if (iVar14 <= (int)uVar19) break;
      UnicodeString::append(&digitsString,L'#');
    }
LAB_00256b04:
    iVar21 = 0;
  }
  while( true ) {
    uVar19 = digitsString.fUnion.fFields.fLength;
    if (-1 < digitsString.fUnion.fStackFields.fLengthAndFlags) {
      uVar19 = (int)digitsString.fUnion.fStackFields.fLengthAndFlags >> 5;
    }
    if (iVar10 <= uVar19 + iVar21) break;
    UnicodeString::insert(&digitsString,0,L'0');
  }
  for (iVar21 = -iVar21; iVar21 < iVar11; iVar21 = iVar21 + 1) {
    UnicodeString::append(&digitsString,L'0');
  }
  uVar19 = digitsString.fUnion.fFields.fLength;
  if (-1 < digitsString.fUnion.fStackFields.fLengthAndFlags) {
    uVar19 = (int)digitsString.fUnion.fStackFields.fLengthAndFlags >> 5;
  }
  iVar20 = uprv_max_63(uVar5 + uVar16 + 1,uVar19 - iVar21);
  if (x != 100) {
    iVar20 = uprv_max_63(x,iVar20);
  }
  iVar10 = -iVar21;
  if (iVar12 != 100) {
    iVar10 = uprv_min_63(-iVar12,iVar10);
  }
  iVar21 = -(iVar21 + iVar20);
  while (iVar10 < iVar20) {
    uVar19 = digitsString.fUnion.fFields.fLength;
    if (-1 < digitsString.fUnion.fStackFields.fLengthAndFlags) {
      uVar19 = (int)digitsString.fUnion.fStackFields.fLengthAndFlags >> 5;
    }
    offset = uVar19 + iVar21;
    cVar7 = L'#';
    if (-1 < offset && offset < (int)uVar19) {
      cVar7 = UnicodeString::doCharAt(&digitsString,offset);
    }
    UnicodeString::append(__return_storage_ptr__,cVar7);
    if ((((int)uVar16 < iVar20 + -1) && (0 < (int)local_498)) &&
       ((int)(~uVar16 + iVar20) % (int)local_498 == 0)) {
      cVar7 = L',';
LAB_00256cba:
      UnicodeString::append(__return_storage_ptr__,cVar7);
    }
    else if (((1 < iVar20) && (cVar7 = L',', ~uVar16 + iVar20 == 0)) ||
            (cVar7 = L'.', (iVar20 == 1 & (iVar10 < 0 | bVar1)) == 1)) goto LAB_00256cba;
    iVar21 = iVar21 + 1;
    iVar20 = iVar20 + -1;
  }
  iVar10 = uprv_min_63(100,-1);
  if (iVar15 != iVar10) {
    UnicodeString::append(__return_storage_ptr__,L'E');
    if (bVar2 != false) {
      UnicodeString::append(__return_storage_ptr__,L'+');
    }
    iVar21 = 0;
    if (0 < iVar15) {
      iVar21 = iVar15;
    }
    while (iVar21 != 0) {
      UnicodeString::append(__return_storage_ptr__,L'0');
      iVar21 = iVar21 + -1;
    }
  }
  sVar3 = (__return_storage_ptr__->fUnion).fStackFields.fLengthAndFlags;
  if (sVar3 < 0) {
    iVar21 = (__return_storage_ptr__->fUnion).fFields.fLength;
  }
  else {
    iVar21 = (int)sVar3 >> 5;
  }
  if ((psp.fUnion.fStackFields.fLengthAndFlags._0_1_ & 1) == 0) {
    UnicodeString::append(__return_storage_ptr__,&psp);
  }
  AffixUtils::escape((UnicodeString *)&incrementQuantity,&ps);
  UnicodeString::append(__return_storage_ptr__,(UnicodeString *)&incrementQuantity);
  UnicodeString::~UnicodeString((UnicodeString *)&incrementQuantity);
  if ((iVar9 == -1) || (((ulong)NVar4 & 1) != 0)) goto LAB_00256f3d;
  while( true ) {
    sVar3 = (__return_storage_ptr__->fUnion).fStackFields.fLengthAndFlags;
    if (sVar3 < 0) {
      iVar20 = (__return_storage_ptr__->fUnion).fFields.fLength;
    }
    else {
      iVar20 = (int)sVar3 >> 5;
    }
    if (iVar9 <= iVar20) break;
    UnicodeString::insert(__return_storage_ptr__,startIndex,L'#');
    iVar21 = iVar21 + 1;
  }
  if (UNUM_PAD_AFTER_SUFFIX < NVar4.fValue) goto LAB_00256f2f;
  status_00 = &switchD_00256dee::switchdataD_002e0238;
  switch((long)&switchD_00256dee::switchdataD_002e0238 +
         (long)(int)(&switchD_00256dee::switchdataD_002e0238)[(ulong)NVar4 >> 0x20]) {
  case 0x256df0:
    UnicodeString::UnicodeString(&local_f0,&paddingString);
    iVar20 = escapePaddingString(&local_f0,__return_storage_ptr__,0,(UErrorCode *)status_00);
    UnicodeString::~UnicodeString(&local_f0);
    UnicodeString::insert(__return_storage_ptr__,0,L'*');
    goto LAB_00256ef8;
  case 0x256e39:
    UnicodeString::UnicodeString(&local_170,&paddingString);
    escapePaddingString(&local_170,__return_storage_ptr__,iVar21,(UErrorCode *)status_00);
    UnicodeString::~UnicodeString(&local_170);
    UnicodeString::insert(__return_storage_ptr__,iVar21,L'*');
    break;
  case 0x256e7f:
    UnicodeString::append(__return_storage_ptr__,L'*');
    UnicodeString::UnicodeString(&local_1b0,&paddingString);
    sVar3 = (__return_storage_ptr__->fUnion).fStackFields.fLengthAndFlags;
    if (sVar3 < 0) {
      iVar20 = (__return_storage_ptr__->fUnion).fFields.fLength;
    }
    else {
      iVar20 = (int)sVar3 >> 5;
    }
    escapePaddingString(&local_1b0,__return_storage_ptr__,iVar20,(UErrorCode *)status_00);
    UnicodeString::~UnicodeString(&local_1b0);
    break;
  case 0x256eaf:
    UnicodeString::UnicodeString(&local_130,&paddingString);
    iVar20 = escapePaddingString(&local_130,__return_storage_ptr__,startIndex,
                                 (UErrorCode *)status_00);
    UnicodeString::~UnicodeString(&local_130);
    UnicodeString::insert(__return_storage_ptr__,startIndex,L'*');
LAB_00256ef8:
    startIndex = startIndex + iVar20 + 1;
    iVar21 = iVar21 + 1 + iVar20;
  }
LAB_00256f2f:
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
LAB_00256f3d:
    if (((np.fUnion.fStackFields.fLengthAndFlags._0_1_ & 1) != 0) &&
       ((ns.fUnion.fStackFields.fLengthAndFlags._0_1_ & 1) != 0)) {
      if ((npp.fUnion.fStackFields.fLengthAndFlags & 1U) == 0) {
        if (-1 < npp.fUnion.fStackFields.fLengthAndFlags) {
          npp.fUnion.fFields.fLength = (int)npp.fUnion.fStackFields.fLengthAndFlags >> 5;
        }
        if ((npp.fUnion.fFields.fLength == 1) &&
           (cVar7 = UnicodeString::doCharAt(&npp,0), cVar7 == L'-')) {
          if (-1 < nsp.fUnion.fStackFields.fLengthAndFlags) {
            nsp.fUnion.fFields.fLength = (int)nsp.fUnion.fStackFields.fLengthAndFlags >> 5;
          }
          if (nsp.fUnion.fFields.fLength == 0) goto LAB_0025702e;
        }
      }
      else if ((nsp.fUnion.fStackFields.fLengthAndFlags & 1U) != 0) goto LAB_0025702e;
    }
    UnicodeString::append(__return_storage_ptr__,L';');
    if ((npp.fUnion.fStackFields.fLengthAndFlags & 1U) == 0) {
      UnicodeString::append(__return_storage_ptr__,&npp);
    }
    AffixUtils::escape((UnicodeString *)&incrementQuantity,&np);
    UnicodeString::append(__return_storage_ptr__,(UnicodeString *)&incrementQuantity);
    UnicodeString::~UnicodeString((UnicodeString *)&incrementQuantity);
    UnicodeString::UnicodeString((UnicodeString *)&incrementQuantity,__return_storage_ptr__);
    UnicodeString::doAppend
              (__return_storage_ptr__,(UnicodeString *)&incrementQuantity,startIndex,
               iVar21 - startIndex);
    if ((nsp.fUnion.fStackFields.fLengthAndFlags & 1U) == 0) {
      UnicodeString::append(__return_storage_ptr__,&nsp);
    }
    AffixUtils::escape(&str,&ns);
    UnicodeString::append(__return_storage_ptr__,&str);
    UnicodeString::~UnicodeString(&str);
    UnicodeString::~UnicodeString((UnicodeString *)&incrementQuantity);
  }
LAB_0025702e:
  UnicodeString::~UnicodeString(&digitsString);
  UnicodeString::~UnicodeString(&nsp);
  UnicodeString::~UnicodeString(&ns);
  UnicodeString::~UnicodeString(&npp);
  UnicodeString::~UnicodeString(&np);
  UnicodeString::~UnicodeString(&psp);
  UnicodeString::~UnicodeString(&ps);
  UnicodeString::~UnicodeString(&ppp);
  UnicodeString::~UnicodeString(&pp);
  UnicodeString::~UnicodeString(&paddingString);
  return __return_storage_ptr__;
}

Assistant:

UnicodeString PatternStringUtils::propertiesToPatternString(const DecimalFormatProperties& properties,
                                                            UErrorCode& status) {
    UnicodeString sb;

    // Convenience references
    // The uprv_min() calls prevent DoS
    int dosMax = 100;
    int groupingSize = uprv_min(properties.secondaryGroupingSize, dosMax);
    int firstGroupingSize = uprv_min(properties.groupingSize, dosMax);
    int paddingWidth = uprv_min(properties.formatWidth, dosMax);
    NullableValue<PadPosition> paddingLocation = properties.padPosition;
    UnicodeString paddingString = properties.padString;
    int minInt = uprv_max(uprv_min(properties.minimumIntegerDigits, dosMax), 0);
    int maxInt = uprv_min(properties.maximumIntegerDigits, dosMax);
    int minFrac = uprv_max(uprv_min(properties.minimumFractionDigits, dosMax), 0);
    int maxFrac = uprv_min(properties.maximumFractionDigits, dosMax);
    int minSig = uprv_min(properties.minimumSignificantDigits, dosMax);
    int maxSig = uprv_min(properties.maximumSignificantDigits, dosMax);
    bool alwaysShowDecimal = properties.decimalSeparatorAlwaysShown;
    int exponentDigits = uprv_min(properties.minimumExponentDigits, dosMax);
    bool exponentShowPlusSign = properties.exponentSignAlwaysShown;
    UnicodeString pp = properties.positivePrefix;
    UnicodeString ppp = properties.positivePrefixPattern;
    UnicodeString ps = properties.positiveSuffix;
    UnicodeString psp = properties.positiveSuffixPattern;
    UnicodeString np = properties.negativePrefix;
    UnicodeString npp = properties.negativePrefixPattern;
    UnicodeString ns = properties.negativeSuffix;
    UnicodeString nsp = properties.negativeSuffixPattern;

    // Prefixes
    if (!ppp.isBogus()) {
        sb.append(ppp);
    }
    sb.append(AffixUtils::escape(pp));
    int afterPrefixPos = sb.length();

    // Figure out the grouping sizes.
    int grouping1, grouping2, grouping;
    if (groupingSize != uprv_min(dosMax, -1) && firstGroupingSize != uprv_min(dosMax, -1) &&
        groupingSize != firstGroupingSize) {
        grouping = groupingSize;
        grouping1 = groupingSize;
        grouping2 = firstGroupingSize;
    } else if (groupingSize != uprv_min(dosMax, -1)) {
        grouping = groupingSize;
        grouping1 = 0;
        grouping2 = groupingSize;
    } else if (firstGroupingSize != uprv_min(dosMax, -1)) {
        grouping = groupingSize;
        grouping1 = 0;
        grouping2 = firstGroupingSize;
    } else {
        grouping = 0;
        grouping1 = 0;
        grouping2 = 0;
    }
    int groupingLength = grouping1 + grouping2 + 1;

    // Figure out the digits we need to put in the pattern.
    double roundingInterval = properties.roundingIncrement;
    UnicodeString digitsString;
    int digitsStringScale = 0;
    if (maxSig != uprv_min(dosMax, -1)) {
        // Significant Digits.
        while (digitsString.length() < minSig) {
            digitsString.append(u'@');
        }
        while (digitsString.length() < maxSig) {
            digitsString.append(u'#');
        }
    } else if (roundingInterval != 0.0) {
        // Rounding Interval.
        digitsStringScale = -roundingutils::doubleFractionLength(roundingInterval);
        // TODO: Check for DoS here?
        DecimalQuantity incrementQuantity;
        incrementQuantity.setToDouble(roundingInterval);
        incrementQuantity.adjustMagnitude(-digitsStringScale);
        incrementQuantity.roundToMagnitude(0, kDefaultMode, status);
        UnicodeString str = incrementQuantity.toPlainString();
        if (str.charAt(0) == u'-') {
            // TODO: Unsupported operation exception or fail silently?
            digitsString.append(str, 1, str.length() - 1);
        } else {
            digitsString.append(str);
        }
    }
    while (digitsString.length() + digitsStringScale < minInt) {
        digitsString.insert(0, u'0');
    }
    while (-digitsStringScale < minFrac) {
        digitsString.append(u'0');
        digitsStringScale--;
    }

    // Write the digits to the string builder
    int m0 = uprv_max(groupingLength, digitsString.length() + digitsStringScale);
    m0 = (maxInt != dosMax) ? uprv_max(maxInt, m0) - 1 : m0 - 1;
    int mN = (maxFrac != dosMax) ? uprv_min(-maxFrac, digitsStringScale) : digitsStringScale;
    for (int magnitude = m0; magnitude >= mN; magnitude--) {
        int di = digitsString.length() + digitsStringScale - magnitude - 1;
        if (di < 0 || di >= digitsString.length()) {
            sb.append(u'#');
        } else {
            sb.append(digitsString.charAt(di));
        }
        if (magnitude > grouping2 && grouping > 0 && (magnitude - grouping2) % grouping == 0) {
            sb.append(u',');
        } else if (magnitude > 0 && magnitude == grouping2) {
            sb.append(u',');
        } else if (magnitude == 0 && (alwaysShowDecimal || mN < 0)) {
            sb.append(u'.');
        }
    }

    // Exponential notation
    if (exponentDigits != uprv_min(dosMax, -1)) {
        sb.append(u'E');
        if (exponentShowPlusSign) {
            sb.append(u'+');
        }
        for (int i = 0; i < exponentDigits; i++) {
            sb.append(u'0');
        }
    }

    // Suffixes
    int beforeSuffixPos = sb.length();
    if (!psp.isBogus()) {
        sb.append(psp);
    }
    sb.append(AffixUtils::escape(ps));

    // Resolve Padding
    if (paddingWidth != -1 && !paddingLocation.isNull()) {
        while (paddingWidth - sb.length() > 0) {
            sb.insert(afterPrefixPos, u'#');
            beforeSuffixPos++;
        }
        int addedLength;
        switch (paddingLocation.get(status)) {
            case PadPosition::UNUM_PAD_BEFORE_PREFIX:
                addedLength = escapePaddingString(paddingString, sb, 0, status);
                sb.insert(0, u'*');
                afterPrefixPos += addedLength + 1;
                beforeSuffixPos += addedLength + 1;
                break;
            case PadPosition::UNUM_PAD_AFTER_PREFIX:
                addedLength = escapePaddingString(paddingString, sb, afterPrefixPos, status);
                sb.insert(afterPrefixPos, u'*');
                afterPrefixPos += addedLength + 1;
                beforeSuffixPos += addedLength + 1;
                break;
            case PadPosition::UNUM_PAD_BEFORE_SUFFIX:
                escapePaddingString(paddingString, sb, beforeSuffixPos, status);
                sb.insert(beforeSuffixPos, u'*');
                break;
            case PadPosition::UNUM_PAD_AFTER_SUFFIX:
                sb.append(u'*');
                escapePaddingString(paddingString, sb, sb.length(), status);
                break;
        }
        if (U_FAILURE(status)) { return sb; }
    }

    // Negative affixes
    // Ignore if the negative prefix pattern is "-" and the negative suffix is empty
    if (!np.isBogus() || !ns.isBogus() || (npp.isBogus() && !nsp.isBogus()) ||
        (!npp.isBogus() && (npp.length() != 1 || npp.charAt(0) != u'-' || nsp.length() != 0))) {
        sb.append(u';');
        if (!npp.isBogus()) {
            sb.append(npp);
        }
        sb.append(AffixUtils::escape(np));
        // Copy the positive digit format into the negative.
        // This is optional; the pattern is the same as if '#' were appended here instead.
        // NOTE: It is not safe to append the UnicodeString to itself, so we need to copy.
        // See http://bugs.icu-project.org/trac/ticket/13707
        UnicodeString copy(sb);
        sb.append(copy, afterPrefixPos, beforeSuffixPos - afterPrefixPos);
        if (!nsp.isBogus()) {
            sb.append(nsp);
        }
        sb.append(AffixUtils::escape(ns));
    }

    return sb;
}